

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump2.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  size_type __len1;
  long lVar1;
  int iVar2;
  char *__s;
  uint64_t uVar3;
  long lVar4;
  size_t __len2;
  ulong uVar5;
  long lVar6;
  int iVar7;
  long *plVar8;
  bool bVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  bool bVar10;
  bool bVar11;
  filehandle f;
  string srcFilename;
  string dstFilename;
  undefined1 local_149;
  undefined1 local_148 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_140;
  char *local_138;
  char *pcStack_130;
  undefined2 local_128;
  int local_11c;
  Hexdumper<unsigned_char> local_118;
  int64_t local_108;
  undefined8 local_100;
  _Storage<long,_true> local_f8;
  undefined1 local_f0;
  int64_t local_e8;
  undefined1 local_e0;
  int64_t local_d8;
  undefined1 local_d0;
  int64_t local_c8;
  undefined1 local_c0;
  uint64_t local_b8;
  char local_b0;
  int local_a8;
  undefined4 local_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined4 uStack_98;
  undefined1 local_94;
  undefined4 local_90;
  char local_8c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  int local_44;
  long local_40;
  long local_38;
  
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  local_f0 = 0;
  local_e0 = 0;
  local_d0 = 0;
  local_c0 = 0;
  local_b0 = '\0';
  local_a8 = 1;
  local_a4 = 0;
  uStack_a0 = 0;
  uStack_9c = 0;
  uStack_98 = 0;
  local_94 = 1;
  local_8c = '\0';
  _Stack_140._M_pi._4_4_ = 1;
  _Stack_140._M_pi._0_4_ = argc;
  local_128._0_1_ = false;
  local_128._1_1_ = false;
  if (argc == 1) {
    local_138 = (char *)0x0;
    pcStack_130 = (char *)0x0;
  }
  else {
    local_138 = argv[1];
    if (*local_138 == '\0') {
      lVar4 = 0;
    }
    else {
      lVar6 = 0;
      do {
        lVar4 = lVar6 + 1;
        lVar1 = lVar6 + 1;
        lVar6 = lVar4;
      } while (local_138[lVar1] != '\0');
    }
    pcStack_130 = local_138 + lVar4;
  }
  bVar9 = local_138 != (char *)0x0 || argc != 1;
  local_148 = (undefined1  [8])argv;
  if (local_138 != (char *)0x0 || argc != 1) {
    local_100 = 0;
    local_108 = 0;
    iVar7 = 0;
    do {
      iVar2 = ArgParser::ArgIterator::option((ArgIterator *)local_148);
      switch(iVar2) {
      case 0x65:
        local_e8 = ArgParser::ArgIterator::getint((ArgIterator *)local_148);
        local_e0 = 1;
        break;
      case 0x66:
        local_94 = 0;
        break;
      case 0x67:
      case 0x68:
      case 0x69:
      case 0x6a:
      case 0x6b:
      case 0x6d:
      case 0x6e:
      case 0x71:
      case 0x72:
      case 0x74:
      case 0x75:
      case 0x76:
switchD_001025e0_caseD_67:
        puts(
            "Usage: dump2 [opt] <infile> [outfile]\n        -b BASE    -- what offset to give the start of the file.\n        -o START   -- where to start dumping\n        -e END     -- where to end dumping\n        -l SIZE    -- how many bytes to dump\n        -w WIDTH   -- nr of items per line\n        -s STEP    -- how many bytes to skip between lines\n        -f         -- don\'t summarize, full dump\n        -S THRESH  -- summarize threshold\n        -x         -- only hex\n        -xx        -- only ascii\n        -1, -2, -4, -8  -- wordsize"
            );
        local_100 = 1;
        bVar11 = false;
        goto LAB_0010277d;
      case 0x6c:
        local_d8 = ArgParser::ArgIterator::getint((ArgIterator *)local_148);
        local_d0 = 1;
        break;
      case 0x6f:
        local_f8._M_value = ArgParser::ArgIterator::getint((ArgIterator *)local_148);
        local_f0 = 1;
        break;
      case 0x70:
        local_108 = ArgParser::ArgIterator::getint((ArgIterator *)local_148);
        break;
      case 0x73:
        uVar3 = ArgParser::ArgIterator::getuint((ArgIterator *)local_148);
        uStack_a0 = (undefined4)uVar3;
        uStack_9c = (undefined4)(uVar3 >> 0x20);
        break;
      case 0x77:
        uVar3 = ArgParser::ArgIterator::getuint((ArgIterator *)local_148);
        local_a4 = (undefined4)uVar3;
        break;
      case 0x78:
        iVar2 = ArgParser::ArgIterator::count((ArgIterator *)local_148);
        if (iVar2 == 2) {
          uStack_98 = 2;
        }
        else {
          uStack_98 = 1;
        }
        break;
      default:
        uVar5 = (ulong)(iVar2 - 0x31U);
        if (iVar2 - 0x31U < 0x32) {
          if ((0x8bUL >> (uVar5 & 0x3f) & 1) == 0) {
            if (uVar5 == 0x22) {
              uVar3 = ArgParser::ArgIterator::getuint((ArgIterator *)local_148);
              local_90 = (undefined4)uVar3;
              bVar11 = true;
              if (local_8c == '\0') {
                local_8c = '\x01';
              }
              goto LAB_0010277d;
            }
            if (uVar5 != 0x31) goto LAB_00102656;
            local_c8 = ArgParser::ArgIterator::getint((ArgIterator *)local_148);
            local_c0 = 1;
          }
          else {
            local_a8 = ArgParser::ArgIterator::option((ArgIterator *)local_148);
            local_a8 = local_a8 + -0x30;
          }
          break;
        }
LAB_00102656:
        if (iVar2 != -1) goto switchD_001025e0_caseD_67;
        local_11c = iVar7 + 1;
        bVar11 = true;
        if (iVar7 == 1) {
          __s = ArgParser::ArgIterator::getstr((ArgIterator *)local_148);
          this_00 = &local_68;
        }
        else {
          bVar10 = iVar7 != 0;
          iVar7 = local_11c;
          if (bVar10) goto LAB_0010277d;
          __s = ArgParser::ArgIterator::getstr((ArgIterator *)local_148);
          this_00 = &local_88;
        }
        __len1 = this_00->_M_string_length;
        __len2 = strlen(__s);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                  (this_00,0,__len1,__s,__len2);
        iVar7 = local_11c;
        goto LAB_0010277d;
      }
      bVar11 = true;
LAB_0010277d:
      if (!bVar11) break;
      lVar4 = (long)_Stack_140._M_pi._4_4_;
      if (_Stack_140._M_pi._4_4_ != (int)_Stack_140._M_pi) {
        _Stack_140._M_pi._4_4_ = _Stack_140._M_pi._4_4_ + 1;
        local_128._0_1_ = false;
        local_128._1_1_ = false;
        if (_Stack_140._M_pi._4_4_ == (int)_Stack_140._M_pi) {
          local_138 = (char *)0x0;
          pcStack_130 = (char *)0x0;
        }
        else {
          local_138 = *(char **)((long)local_148 + (lVar4 * 2 + 2) * 4);
          if (*local_138 == '\0') {
            lVar4 = 0;
          }
          else {
            lVar6 = 0;
            do {
              lVar4 = lVar6 + 1;
              lVar1 = lVar6 + 1;
              lVar6 = lVar4;
            } while (local_138[lVar1] != '\0');
          }
          pcStack_130 = local_138 + lVar4;
        }
      }
      bVar9 = local_138 != (char *)0x0 || _Stack_140._M_pi._4_4_ != argc;
    } while (bVar9);
    bVar11 = (int)local_108 == 0;
    iVar2 = (int)local_100;
  }
  else {
    bVar11 = true;
    iVar7 = 0;
    iVar2 = 0;
  }
  if (bVar9) goto LAB_00102a1e;
  if ((bVar11) && (iVar7 == 0 || 2 < iVar7)) {
    puts(
        "Usage: dump2 [opt] <infile> [outfile]\n        -b BASE    -- what offset to give the start of the file.\n        -o START   -- where to start dumping\n        -e END     -- where to end dumping\n        -l SIZE    -- how many bytes to dump\n        -w WIDTH   -- nr of items per line\n        -s STEP    -- how many bytes to skip between lines\n        -f         -- don\'t summarize, full dump\n        -S THRESH  -- summarize threshold\n        -x         -- only hex\n        -xx        -- only ascii\n        -1, -2, -4, -8  -- wordsize"
        );
    iVar2 = 1;
    goto LAB_00102a1e;
  }
  DumpParams::resolveLineFormat((DumpParams *)&local_f8);
  local_148 = (undefined1  [8])0x0;
  _Stack_140._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (local_88._M_string_length == 0) {
    plVar8 = (long *)0x0;
    this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_001029a0:
    DumpParams::applyFormat((DumpParams *)&local_f8,(ostream *)&std::cout);
    if (plVar8 == (long *)0x0) {
      puts("Nothing to do");
      iVar2 = 1;
    }
    else {
      local_118._first = (uchar *)(*plVar8 + plVar8[2]);
      local_118._last = local_118._first + local_d8;
      Hex::operator<<((ostream *)&std::cout,&local_118);
      iVar2 = 0;
    }
  }
  else {
    iVar2 = open(local_88._M_dataplus._M_p,0);
    filehandle::operator=((filehandle *)local_148,iVar2);
    local_b8 = filehandle::size((filehandle *)local_148);
    if (local_b0 == '\0') {
      local_b0 = '\x01';
    }
    bVar9 = DumpParams::resolveSizes((DumpParams *)&local_f8);
    if (bVar9) {
      local_38 = local_f8._M_value - local_c8;
      local_40 = local_e8 - local_c8;
      local_44 = 1;
      local_118._first = (uchar *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<mappedmem,std::allocator<mappedmem>,filehandle&,long,long,int>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_118._last,
                 (mappedmem **)&local_118,(allocator<mappedmem> *)&local_149,(filehandle *)local_148
                 ,&local_38,&local_40,&local_44);
      this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._last;
      plVar8 = (long *)local_118._first;
      local_118._first = (uchar *)0x0;
      local_118._last = (uchar *)0x0;
      goto LAB_001029a0;
    }
    iVar2 = 1;
    this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  if (_Stack_140._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_140._M_pi);
  }
LAB_00102a1e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                             local_68.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,
                    CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                             local_88.field_2._M_local_buf[0]) + 1);
  }
  return iVar2;
}

Assistant:

int main(int argc, char**argv)
{
    std::string srcFilename;
    std::string dstFilename;
    DumpParams params;
    int processId = 0;

    int argsfound = 0; 
    for (auto& arg : ArgParser(argc, argv))
        switch(arg.option())
        {
          // options from 'dump', not yet implemented:
          //   -h  : dump hashes
          //   -ripemd160
          //   -sha1, -sha2, -sha3, -sha5, -sum
          //   -md5, -md2, -md4, -md160
          //   -a : strings
          //   -crc
          //   -c : raw selected data to stdout.
          //   -r SIZE  : specify readchunk
          //
          // todo: add choice of reading via stdio, or via mmap
          // todo: add choice of outputting a hexdump, rawdata, stringdump, to dstFilename

            case 'b': params.baseOffset = arg.getint(); break;  // the offset at file pos 0
            case 'o': params.offset = arg.getint(); break;
            case 'e': params.endOffset = arg.getint(); break;
            case 'l': params.length = arg.getint(); break;
            case 'p': processId = arg.getint(); break;

            case 'w': params.unitsPerLine = arg.getuint(); break;
            case 's': params.stepSize = arg.getuint(); break;
            case 'f': params.summarize = false; break;
            case 'S': params.summarizeThreshold = arg.getuint(); break;
            case 'x': if (arg.count()==2)
                          params.dumpformat = DUMP_ASCII; 
                      else
                          params.dumpformat = DUMP_HEX; 
                      break;
            case '1': case '2': case '4': case '8':
                params.dumpUnitSize = arg.option()-'0';
                break;

            case -1:
                switch (argsfound++) {
                    case 0: srcFilename = arg.getstr(); break;
                    case 1: dstFilename = arg.getstr(); break;
                }
                break;

            default:
                usage();
                return 1;
        }

    if (processId==0 && (argsfound==0 || argsfound>2))
    {
        usage();
        return 1;
    }

    params.resolveLineFormat();

    filehandle f;
#ifdef __MACH__
    std::shared_ptr<MachVirtualMemory> vmem;
#endif
    std::shared_ptr<mappedmem> mmem;

    if (!srcFilename.empty()) {
        f = open(srcFilename.c_str(), O_RDONLY);
        params.fileSize = f.size();

        if (!params.resolveSizes())
            return 1;
        mmem = std::make_shared<mappedmem>(f, *params.offset - *params.baseOffset, *params.endOffset - *params.baseOffset, PROT_READ);
    }
#ifdef __MACH__
    else if (processId) {
        try {
        task_t task = MachOpenProcessByPid(processId);
        vmem = std::make_shared<MachVirtualMemory>(task, *params.offset, *params.length);
        }
        catch(std::exception& e)
        {
            std::cout << "ERROR " << e.what() << "\n";
        }
    }
#endif

    params.applyFormat(std::cout);

    if (mmem)
        std::cout << Hex::dumper(mmem->data(), mmem->data()+*params.length);
#ifdef __MACH__
    else if (vmem)
        std::cout << Hex::dumper(vmem->begin(), vmem->end());
#endif
    else {
        printf("Nothing to do\n");
        return 1;
    }